

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

double GetDynamicLengths(ZopfliLZ77Store *lz77,size_t lstart,size_t lend,uint *ll_lengths,
                        uint *d_lengths)

{
  size_t in_RCX;
  size_t in_RDX;
  ZopfliLZ77Store *in_RSI;
  size_t *in_R8;
  double dVar1;
  size_t d_counts [32];
  size_t ll_counts [288];
  uint *in_stack_fffffffffffff5c8;
  int in_stack_fffffffffffff5d4;
  size_t in_stack_fffffffffffff5d8;
  size_t *in_stack_fffffffffffff5e0;
  size_t *in_stack_ffffffffffffffd0;
  
  ZopfliLZ77GetHistogram(in_RSI,in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  ZopfliCalculateBitLengths
            (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d4,
             in_stack_fffffffffffff5c8);
  ZopfliCalculateBitLengths
            (in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d4,
             in_stack_fffffffffffff5c8);
  PatchDistanceCodesForBuggyDecoders((uint *)in_R8);
  dVar1 = TryOptimizeHuffmanForRle
                    ((ZopfliLZ77Store *)ll_counts[0x89],ll_counts[0x88],ll_counts[0x87],
                     (size_t *)ll_counts[0x86],(size_t *)ll_counts[0x85],(uint *)ll_counts[0x84],
                     (uint *)ll_counts[0x8c]);
  return dVar1;
}

Assistant:

static double GetDynamicLengths(const ZopfliLZ77Store* lz77,
                                size_t lstart, size_t lend,
                                unsigned* ll_lengths, unsigned* d_lengths) {
  size_t ll_counts[ZOPFLI_NUM_LL];
  size_t d_counts[ZOPFLI_NUM_D];

  ZopfliLZ77GetHistogram(lz77, lstart, lend, ll_counts, d_counts);
  ll_counts[256] = 1;  /* End symbol. */
  ZopfliCalculateBitLengths(ll_counts, ZOPFLI_NUM_LL, 15, ll_lengths);
  ZopfliCalculateBitLengths(d_counts, ZOPFLI_NUM_D, 15, d_lengths);
  PatchDistanceCodesForBuggyDecoders(d_lengths);
  return TryOptimizeHuffmanForRle(
      lz77, lstart, lend, ll_counts, d_counts, ll_lengths, d_lengths);
}